

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
D2xNvmFlash::getLockRegions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,D2xNvmFlash *this)

{
  uint uVar1;
  byte bVar2;
  uint32_t addr_00;
  reference rVar3;
  reference local_48;
  uint local_38;
  uint32_t region;
  allocator<bool> local_22;
  undefined1 local_21;
  uint32_t local_20;
  byte local_19;
  uint32_t addr;
  uint8_t lockBits;
  D2xNvmFlash *this_local;
  vector<bool,_std::allocator<bool>_> *regions;
  
  local_19 = 0;
  local_20 = 0x804006;
  local_21 = 0;
  uVar1 = (this->super_Flash)._lockRegions;
  _addr = this;
  this_local = (D2xNvmFlash *)__return_storage_ptr__;
  std::allocator<bool>::allocator(&local_22);
  std::vector<bool,_std::allocator<bool>_>::vector(__return_storage_ptr__,(ulong)uVar1,&local_22);
  std::allocator<bool>::~allocator(&local_22);
  for (local_38 = 0; addr_00 = local_20, local_38 < (this->super_Flash)._lockRegions;
      local_38 = local_38 + 1) {
    if ((local_38 & 7) == 0) {
      local_20 = local_20 + 1;
      local_19 = Samba::readByte((this->super_Flash)._samba,addr_00);
    }
    bVar2 = local_19 >> (local_38 & 7);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)local_38);
    local_48 = rVar3;
    std::_Bit_reference::operator=(&local_48,(bVar2 & 1) == 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
D2xNvmFlash::getLockRegions()
{
    uint8_t lockBits = 0;
    uint32_t addr = NVM_UR_ADDR + NVM_UR_NVM_LOCK_OFFSET;
    std::vector<bool> regions(_lockRegions);

    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (region % 8 == 0)
            lockBits = _samba.readByte(addr++);
        regions[region] = (lockBits & (1 << (region % 8))) == 0;
    }

    return regions;
}